

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmaster.c
# Opt level: O1

bool_t CheckMandatory(ebml_master *Element,bool_t bWithDefault,int ForProfile)

{
  ebml_context *Context;
  ebml_element *peVar1;
  ebml_semantic *peVar2;
  
  peVar2 = ((Element->Base).Context)->Semantic;
  Context = peVar2->eClass;
  while( true ) {
    if (Context == (ebml_context *)0x0) {
      return 1;
    }
    if ((((peVar2->Mandatory != 0) && ((peVar2->DisabledProfile & ForProfile) == 0)) &&
        ((bWithDefault != 0 || (Context->HasDefault == 0)))) &&
       (peVar1 = EBML_MasterFindFirstElt(Element,Context,0,0,0), peVar1 == (ebml_element *)0x0))
    break;
    Context = peVar2[1].eClass;
    peVar2 = peVar2 + 1;
  }
  return 0;
}

Assistant:

static bool_t CheckMandatory(const ebml_master *Element, bool_t bWithDefault, int ForProfile)
{
    const ebml_semantic *i;
    for (i=Element->Base.Context->Semantic;i->eClass;++i)
    {
        if (i->Mandatory && (i->DisabledProfile & ForProfile) == 0 &&
            (bWithDefault || !i->eClass->HasDefault) &&
            !EBML_MasterFindChild(Element,i->eClass))
            return 0;
    }
    return 1;
}